

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O1

void narrow_stripov_backprop(NarrowConv *nc,IRRef ref,int depth)

{
  byte bVar1;
  jit_State *pjVar2;
  IRIns *pIVar3;
  NarrowIns *pNVar4;
  NarrowIns *pNVar5;
  uint *puVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  NarrowIns *savesp;
  
  pjVar2 = nc->J;
  pIVar3 = (pjVar2->cur).ir;
  uVar11 = (ulong)ref;
  bVar1 = *(byte *)((long)pIVar3 + uVar11 * 8 + 5);
  uVar9 = (ulong)bVar1;
  if ((1 < bVar1 - 0x35) &&
     ((bVar1 != 0x37 || (uVar8 = nc->mode & 0xf000, uVar9 = (ulong)uVar8, uVar8 != 0x1000))))
  goto LAB_0015b96a;
  lVar10 = 0;
  do {
    if ((*(short *)((long)&pjVar2->bpropcache[0].key + lVar10) == (short)ref) &&
       ((*(ushort *)((long)&pjVar2->bpropcache[0].mode + lVar10) & 0xfff) == 0)) {
      uVar9 = (long)&pjVar2->bpropcache[0].key + lVar10;
      bVar7 = false;
    }
    else {
      bVar7 = true;
    }
    if (!bVar7) goto LAB_0015b8e4;
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x80);
  uVar9 = 0;
LAB_0015b8e4:
  if (uVar9 == 0) {
    bVar7 = true;
    if ((depth < 99) && (pNVar4 = nc->sp, pNVar4 < nc->maxsp)) {
      narrow_stripov_backprop(nc,(uint)pIVar3[uVar11].field_0.op1,depth + 1);
      if (nc->sp < nc->maxsp) {
        narrow_stripov_backprop(nc,(uint)*(ushort *)((long)pIVar3 + uVar11 * 8 + 2),depth + 1);
        pNVar5 = nc->sp;
        if (pNVar5 < nc->maxsp) {
          bVar1 = *(byte *)((long)pIVar3 + uVar11 * 8 + 5);
          nc->sp = pNVar5 + 1;
          *pNVar5 = (uint)bVar1 * 0x1000000 + ref + 0xf4130000;
          bVar7 = false;
          goto LAB_0015b965;
        }
      }
      nc->sp = pNVar4;
    }
  }
  else {
    ref = (IRRef)*(ushort *)(uVar9 + 2);
    bVar7 = true;
  }
LAB_0015b965:
  if (!bVar7) {
    return;
  }
LAB_0015b96a:
  puVar6 = nc->sp;
  nc->sp = puVar6 + 1;
  *puVar6 = ref;
  return;
}

Assistant:

static void narrow_stripov_backprop(NarrowConv *nc, IRRef ref, int depth)
{
  jit_State *J = nc->J;
  IRIns *ir = IR(ref);
  if (ir->o == IR_ADDOV || ir->o == IR_SUBOV ||
      (ir->o == IR_MULOV && (nc->mode & IRCONV_CONVMASK) == IRCONV_ANY)) {
    BPropEntry *bp = narrow_bpc_get(nc->J, ref, IRCONV_TOBIT);
    if (bp) {
      ref = bp->val;
    } else if (++depth < NARROW_MAX_BACKPROP && nc->sp < nc->maxsp) {
      NarrowIns *savesp = nc->sp;
      narrow_stripov_backprop(nc, ir->op1, depth);
      if (nc->sp < nc->maxsp) {
	narrow_stripov_backprop(nc, ir->op2, depth);
	if (nc->sp < nc->maxsp) {
	  *nc->sp++ = NARROWINS(IRT(ir->o - IR_ADDOV + IR_ADD, IRT_INT), ref);
	  return;
	}
      }
      nc->sp = savesp;  /* Path too deep, need to backtrack. */
    }
  }
  *nc->sp++ = NARROWINS(NARROW_REF, ref);
}